

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O1

Block * __thiscall
wasm::I64ToI32Lowering::makeSmallShl
          (I64ToI32Lowering *this,Index highBits,Index leftLow,Index leftHigh,Index shift,
          Binary *shiftMask,Binary *widthLessShift)

{
  Builder *pBVar1;
  Builder *pBVar2;
  Expression *pEVar3;
  Binary *pBVar4;
  Binary *this_00;
  Expression *pEVar5;
  Binary *this_01;
  LocalSet *any;
  Block *pBVar6;
  
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  pEVar3 = (Expression *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x18,8);
  pEVar3->_id = LocalGetId;
  *(Index *)(pEVar3 + 1) = leftLow;
  (pEVar3->type).id = 2;
  pBVar4 = (Binary *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
  (pBVar4->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar4->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  pBVar4->op = ShrUInt32;
  pBVar4->left = pEVar3;
  pBVar4->right = (Expression *)widthLessShift;
  Binary::finalize(pBVar4);
  this_00 = (Binary *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_00->op = AndInt32;
  this_00->left = (Expression *)shiftMask;
  this_00->right = (Expression *)pBVar4;
  Binary::finalize(this_00);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  pEVar3 = (Expression *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x18,8);
  pEVar3->_id = LocalGetId;
  *(Index *)(pEVar3 + 1) = leftHigh;
  (pEVar3->type).id = 2;
  pEVar5 = (Expression *)
           MixedArena::allocSpace
                     (&((this->builder)._M_t.
                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                       allocator,0x18,8);
  pEVar5->_id = LocalGetId;
  *(Index *)(pEVar5 + 1) = shift;
  (pEVar5->type).id = 2;
  pBVar4 = (Binary *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
  (pBVar4->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar4->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  pBVar4->op = ShlInt32;
  pBVar4->left = pEVar3;
  pBVar4->right = pEVar5;
  Binary::finalize(pBVar4);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  this_01 = (Binary *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_01->op = OrInt32;
  this_01->left = (Expression *)this_00;
  this_01->right = (Expression *)pBVar4;
  Binary::finalize(this_01);
  any = Builder::makeLocalSet(pBVar1,highBits,(Expression *)this_01);
  pBVar2 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  pEVar3 = (Expression *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x18,8);
  pEVar3->_id = LocalGetId;
  *(Index *)(pEVar3 + 1) = leftLow;
  (pEVar3->type).id = 2;
  pEVar5 = (Expression *)
           MixedArena::allocSpace
                     (&((this->builder)._M_t.
                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                       allocator,0x18,8);
  pEVar5->_id = LocalGetId;
  *(Index *)(pEVar5 + 1) = shift;
  (pEVar5->type).id = 2;
  pBVar4 = (Binary *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x28,8);
  (pBVar4->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar4->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  pBVar4->op = ShlInt32;
  pBVar4->left = pEVar3;
  pBVar4->right = pEVar5;
  Binary::finalize(pBVar4);
  pBVar6 = Builder::blockify(pBVar1,(Expression *)any,(Expression *)pBVar4);
  return pBVar6;
}

Assistant:

Block* makeSmallShl(Index highBits,
                      Index leftLow,
                      Index leftHigh,
                      Index shift,
                      Binary* shiftMask,
                      Binary* widthLessShift) {
    Binary* shiftedInBits = builder->makeBinary(
      AndInt32,
      shiftMask,
      builder->makeBinary(
        ShrUInt32, builder->makeLocalGet(leftLow, Type::i32), widthLessShift));
    Binary* shiftHigh =
      builder->makeBinary(ShlInt32,
                          builder->makeLocalGet(leftHigh, Type::i32),
                          builder->makeLocalGet(shift, Type::i32));
    return builder->blockify(
      builder->makeLocalSet(
        highBits, builder->makeBinary(OrInt32, shiftedInBits, shiftHigh)),
      builder->makeBinary(ShlInt32,
                          builder->makeLocalGet(leftLow, Type::i32),
                          builder->makeLocalGet(shift, Type::i32)));
  }